

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O2

QColor __thiscall QFusionStylePrivate::outline(QFusionStylePrivate *this,QPalette *pal)

{
  QBrush *pQVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  QColor QVar5;
  
  pQVar1 = QPalette::window(pal);
  if (*(int *)(*(long *)pQVar1 + 4) == 0x18) {
    uVar2 = 0xa0a000000001;
    uVar3 = 0;
  }
  else {
    pQVar1 = QPalette::window(pal);
    auVar4 = QColor::darker((int)*(undefined8 *)pQVar1 + 8);
    uVar2 = auVar4._0_8_;
    uVar3 = auVar4._8_8_ & 0xffffffffffff;
  }
  QVar5._8_8_ = uVar3;
  QVar5._0_8_ = uVar2;
  return QVar5;
}

Assistant:

QColor outline(const QPalette &pal) const {
        if (pal.window().style() == Qt::TexturePattern)
            return QColor(0, 0, 0, 160);
        return pal.window().color().darker(140);
    }